

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiWindow *this;
  ImGuiContext_conflict1 *pIVar1;
  bool bVar2;
  ImGuiID id;
  ImVec2 padding;
  
  pIVar1 = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    PushID(user_texture_id);
    id = ImGuiWindow::GetID(this,"#image",(char *)0x0);
    PopID();
    if (frame_padding < 0) {
      padding = (pIVar1->Style).FramePadding;
    }
    else {
      padding.y = (float)frame_padding;
      padding.x = (float)frame_padding;
    }
    bVar2 = ImageButtonEx(id,user_texture_id,size,uv0,uv1,&padding,bg_col,tint_col);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    PushID((void*)(intptr_t)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    const ImVec2 padding = (frame_padding >= 0) ? ImVec2((float)frame_padding, (float)frame_padding) : g.Style.FramePadding;
    return ImageButtonEx(id, user_texture_id, size, uv0, uv1, padding, bg_col, tint_col);
}